

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O3

EStatusCode __thiscall
ObjectsContext::WriteXrefStream(ObjectsContext *this,DictionaryContext *inDictionaryContext)

{
  PrimitiveObjectsWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  EStatusCode EVar3;
  ObjectIDType OVar4;
  ObjectWriteInformation *pOVar5;
  PDFStream *this_01;
  IByteWriter *pIVar6;
  ObjectWriteInformation *pOVar7;
  Trace *this_02;
  ObjectIDType OVar8;
  ObjectsContext *this_03;
  ulong uVar9;
  PDFStream *pPVar10;
  PDFStream *pPVar11;
  ulong uVar12;
  IndirectObjectsReferenceRegistry *this_04;
  string local_58;
  ObjectsContext *local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Index","");
  DictionaryContext::WriteKey(inDictionaryContext,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::StartArray(this_00);
  this_04 = &this->mReferencesRegistry;
  local_38 = this;
  OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
  if (OVar4 != 0) {
    uVar9 = 0;
    do {
      OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
      uVar12 = uVar9;
      if (uVar9 < OVar4) {
        do {
          pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,uVar12);
          if (pOVar5->mIsDirty != true) break;
          uVar12 = uVar12 + 1;
          OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
        } while (uVar12 < OVar4);
      }
      PrimitiveObjectsWriter::WriteInteger(this_00,uVar9,eTokenSeparatorSpace);
      PrimitiveObjectsWriter::WriteInteger(this_00,uVar12 - uVar9,eTokenSeparatorSpace);
      while ((OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04), uVar12 < OVar4 &&
             (pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,uVar12),
             pOVar5->mIsDirty == false))) {
        uVar12 = uVar12 + 1;
      }
      OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
      uVar9 = uVar12;
    } while (uVar12 < OVar4);
  }
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorNone);
  PrimitiveObjectsWriter::EndLine(this_00);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"W","");
  DictionaryContext::WriteKey(inDictionaryContext,&local_58);
  this_03 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  PrimitiveObjectsWriter::StartArray(this_00);
  PrimitiveObjectsWriter::WriteInteger(this_00,1,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteInteger(this_00,8,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteInteger(this_00,8,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorNone);
  PrimitiveObjectsWriter::EndLine(this_00);
  this_01 = StartPDFStream(this_03,inDictionaryContext,true);
  OVar4 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
  if (OVar4 != 0) {
    OVar4 = 0;
    uVar9 = 0;
    do {
      pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,OVar4);
      bVar2 = true;
      if (pOVar5->mIsDirty == true) {
        pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,OVar4);
        uVar12 = uVar9;
        pPVar11 = this_01;
        if (pOVar5->mObjectReferenceType == Used) {
          if (pOVar5->mObjectWritten != true) {
            this_02 = Trace::DefaultTrace();
            bVar2 = false;
            Trace::TraceToLog(this_02,
                              "ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written"
                              ,OVar4);
            goto LAB_001be0cc;
          }
          pPVar10 = this_01;
          pIVar6 = PDFStream::GetWriteStream(this_01);
          WriteXrefNumber((ObjectsContext *)pPVar10,pIVar6,1,1);
          pIVar6 = PDFStream::GetWriteStream(this_01);
          uVar12 = pOVar5->mWritePosition;
        }
        else {
          do {
            uVar12 = uVar12 + 1;
            OVar8 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
            if (OVar8 <= uVar12) break;
            pOVar7 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,uVar12);
          } while ((pOVar7->mIsDirty != true) ||
                  (pOVar7 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_04,uVar12),
                  pOVar7->mObjectReferenceType != Free));
          OVar8 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
          if (uVar12 == OVar8) {
            uVar12 = 0;
          }
          pPVar10 = this_01;
          pIVar6 = PDFStream::GetWriteStream(this_01);
          WriteXrefNumber((ObjectsContext *)pPVar10,pIVar6,0,1);
          pIVar6 = PDFStream::GetWriteStream(this_01);
          uVar9 = uVar12;
        }
        WriteXrefNumber((ObjectsContext *)pPVar11,pIVar6,uVar12,8);
        pPVar11 = this_01;
        pIVar6 = PDFStream::GetWriteStream(this_01);
        WriteXrefNumber((ObjectsContext *)pPVar11,pIVar6,pOVar5->mGenerationNumber,8);
      }
LAB_001be0cc:
      OVar8 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_04);
    } while ((bVar2) && (OVar4 = OVar4 + 1, OVar4 < OVar8));
    this_03 = local_38;
    if (!bVar2) {
      return eFailure;
    }
  }
  EVar3 = EndPDFStream(this_03,this_01);
  return EVar3;
}

Assistant:

EStatusCode ObjectsContext::WriteXrefStream(DictionaryContext* inDictionaryContext)
{
    // k. complement input dictionary with the relevant entries - W and Index
    // then continue with a regular stream, forced to have "length" as direct object
    
    // write Index entry
    inDictionaryContext->WriteKey("Index");
    StartArray();
    
    ObjectIDType startID = 0;
    ObjectIDType firstIDNotInRange;
 
    while(startID < mReferencesRegistry.GetObjectsCount())
    {
        firstIDNotInRange = startID;
        
        // look for first ID that does not require update [for first version of PDF...it will be the end]
        while(firstIDNotInRange < mReferencesRegistry.GetObjectsCount() &&
              mReferencesRegistry.GetNthObjectReference(firstIDNotInRange).mIsDirty)
            ++firstIDNotInRange;
        
        // write section header
        mPrimitiveWriter.WriteInteger(startID);
        mPrimitiveWriter.WriteInteger(firstIDNotInRange - startID);
        
        startID = firstIDNotInRange;
        
        // now promote startID to the next object to update
        while(startID < mReferencesRegistry.GetObjectsCount() &&
              !mReferencesRegistry.GetNthObjectReference(startID).mIsDirty)
            ++startID;        
    }
    
    EndArray();
    EndLine();
    
    // write W entry, which is going to be 1 sizeof(long long) and sizeof(unsigned long), per the types i'm using
    
    size_t typeSize = 1;
    size_t locationSize = sizeof(LongFilePositionType);
    size_t generationSize = sizeof(unsigned long);
    
    inDictionaryContext->WriteKey("W");
    StartArray();
    WriteInteger(typeSize);
    WriteInteger(locationSize);
    WriteInteger(generationSize);
    EndArray();
    EndLine();
    
    // start the xref stream itself
    PDFStream* aStream = StartPDFStream(inDictionaryContext,true);
    
    // now write the table data itself
    EStatusCode status = eSuccess;
    ObjectIDType nextFreeObject = 0;
    
    do {
    
        for(ObjectIDType i = 0; i < mReferencesRegistry.GetObjectsCount() && eSuccess == status;++i)
        {
            if(!mReferencesRegistry.GetNthObjectReference(i).mIsDirty)
                continue;
     
            const ObjectWriteInformation& objectReference = mReferencesRegistry.GetNthObjectReference(i);

            if(objectReference.mObjectReferenceType == ObjectWriteInformation::Used)
            {
                // used object
                
                if(objectReference.mObjectWritten)
                {
                    WriteXrefNumber(aStream->GetWriteStream(),1,typeSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mWritePosition,locationSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                }
                else
                {
                    // object not written. at this point this should not happen, and indicates a failure
                    status = PDFHummus::eFailure;
                    TRACE_LOG1("ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written",i);
                }
            }
            else 
            {
                // free object
                
                ++nextFreeObject;
                // look for next dirty & free object, to be the next item of linked list
                while(nextFreeObject < mReferencesRegistry.GetObjectsCount() &&
                      (!mReferencesRegistry.GetNthObjectReference(nextFreeObject).mIsDirty ||
                       mReferencesRegistry.GetNthObjectReference(nextFreeObject).mObjectReferenceType != ObjectWriteInformation::Free))
                    ++nextFreeObject;
                
                // if reached end of list, then link back to head - 0
                if(nextFreeObject == mReferencesRegistry.GetObjectsCount())
                    nextFreeObject = 0;
     
                WriteXrefNumber(aStream->GetWriteStream(),0,typeSize);
                WriteXrefNumber(aStream->GetWriteStream(),nextFreeObject,locationSize);
                WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                
            }

        }
        
        if(status != eSuccess)
            break;
            
        // end the stream and g'bye
        status = EndPDFStream(aStream);

    } 
    while (false);

    return status;
}